

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvoidReinterprets.cpp
# Opt level: O0

Load * __thiscall
wasm::AvoidReinterprets::optimize(wasm::Function*)::FinalOptimizer::makeReinterpretedLoad(wasm::
Load*,wasm::Expression__(void *this,Load *load,Expression *ptr)

{
  byte bVar1;
  Address offset;
  Builder ptr_00;
  address64_t aVar2;
  Type type;
  Load *pLVar3;
  Builder local_28;
  Builder builder;
  Expression *ptr_local;
  Load *load_local;
  FinalOptimizer *this_local;
  
  builder.wasm = (Module *)ptr;
  Builder::Builder(&local_28,*(Module **)((long)this + 0xe8));
  bVar1 = load->bytes;
  offset.addr = (load->offset).addr;
  aVar2 = wasm::Address::operator_cast_to_unsigned_long(&load->align);
  ptr_00 = builder;
  type = wasm::Type::reinterpret
                   (&(load->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.
                     type);
  pLVar3 = Builder::makeLoad(&local_28,(uint)bVar1,false,offset,(uint)aVar2,
                             (Expression *)ptr_00.wasm,type,(Name)(load->memory).super_IString.str);
  return pLVar3;
}

Assistant:

Load* makeReinterpretedLoad(Load* load, Expression* ptr) {
        Builder builder(*module);
        return builder.makeLoad(load->bytes,
                                false,
                                load->offset,
                                load->align,
                                ptr,
                                load->type.reinterpret(),
                                load->memory);
      }